

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O3

void __thiscall helics::apps::BrokerServer::closeServers(BrokerServer *this)

{
  pointer psVar1;
  shared_ptr<helics::apps::TypedBrokerServer> *server;
  pointer psVar2;
  
  psVar1 = (this->servers).
           super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->servers).
                super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    (*((psVar2->super___shared_ptr<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->_vptr_TypedBrokerServer[3])();
  }
  CLI::std::
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ::clear(&this->servers);
  return;
}

Assistant:

void BrokerServer::closeServers()
{
    for (auto& server : servers) {
        server->stopServer();
    }
    servers.clear();
}